

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O2

int coda_cursor_get_num_elements(coda_cursor *cursor,long *num_elements)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar2 = cursor->stack[cursor->n - 1].type, pcVar2 == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x6a3);
  }
  else {
    cVar1 = pcVar2->backend;
    switch(cVar1) {
    case coda_backend_memory:
      iVar3 = coda_mem_cursor_get_num_elements(cursor,num_elements);
      return iVar3;
    case coda_backend_hdf4:
      iVar3 = -0xb;
      break;
    case coda_backend_hdf5:
      iVar3 = -0xd;
      break;
    case coda_backend_cdf:
      iVar3 = coda_cdf_cursor_get_num_elements(cursor,num_elements);
      return iVar3;
    case coda_backend_netcdf:
      iVar3 = coda_netcdf_cursor_get_num_elements(cursor,num_elements);
      return iVar3;
    case coda_backend_grib:
      iVar3 = coda_grib_cursor_get_num_elements(cursor,num_elements);
      return iVar3;
    default:
      if (cVar1 == coda_backend_binary) {
        iVar3 = coda_bin_cursor_get_num_elements(cursor,num_elements);
        return iVar3;
      }
      if (cVar1 != coda_backend_ascii) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                      ,0x6c5,"int coda_cursor_get_num_elements(const coda_cursor *, long *)");
      }
      iVar3 = coda_ascii_cursor_get_num_elements(cursor,num_elements);
      return iVar3;
    }
    coda_set_error(iVar3,(char *)0x0);
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_get_num_elements(cursor, num_elements);
        case coda_backend_binary:
            return coda_bin_cursor_get_num_elements(cursor, num_elements);
        case coda_backend_memory:
            return coda_mem_cursor_get_num_elements(cursor, num_elements);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_get_num_elements(cursor, num_elements);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_get_num_elements(cursor, num_elements);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_get_num_elements(cursor, num_elements);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_get_num_elements(cursor, num_elements);
        case coda_backend_grib:
            return coda_grib_cursor_get_num_elements(cursor, num_elements);
    }

    assert(0);
    exit(1);
}